

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int nonce_function_ecdsa_adaptor
              (uchar *nonce32,uchar *msg32,uchar *key32,uchar *pk33,uchar *algo,size_t algolen,
              void *data)

{
  uint *puVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  uchar *puVar9;
  uchar *puVar10;
  uchar masked_key [32];
  uchar buf [32];
  uint local_e8 [8];
  secp256k1_sha256 local_c8;
  uchar local_58 [40];
  
  if (algo == (uchar *)0x0) {
    return 0;
  }
  puVar9 = pk33;
  if (data != (void *)0x0) {
    local_c8.s[0] = 0xd14c7bd9;
    local_c8.s[1] = 0x95d35e6;
    local_c8.s[2] = 0xb8490a88;
    local_c8.s[3] = 0xfb00ef74;
    local_c8.s[4] = 0xbaa488f;
    local_c8.s[5] = 0x69366693;
    local_c8.s[6] = 0x1c81c5ba;
    local_c8.s[7] = 0xc33b296a;
    local_c8.bytes = 0x40;
    secp256k1_sha256_write(&local_c8,(uchar *)data,0x20);
    secp256k1_sha256_finalize(&local_c8,(uchar *)local_e8);
    lVar7 = 0;
    do {
      puVar1 = (uint *)(key32 + lVar7);
      uVar4 = puVar1[1];
      uVar5 = puVar1[2];
      uVar6 = puVar1[3];
      *(uint *)((long)local_e8 + lVar7) = *puVar1 ^ *(uint *)((long)local_e8 + lVar7);
      *(uint *)((long)local_e8 + lVar7 + 4) = uVar4 ^ *(uint *)((long)local_e8 + lVar7 + 4);
      *(uint *)((long)local_e8 + lVar7 + 8) = uVar5 ^ *(uint *)((long)local_e8 + lVar7 + 8);
      *(uint *)((long)local_e8 + lVar7 + 0xc) = uVar6 ^ *(uint *)((long)local_e8 + lVar7 + 0xc);
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x20);
  }
  if (algolen == 4) {
    lVar7 = 0;
    do {
      puVar10 = (uchar *)((ulong)puVar9 & 0xffffffff);
      bVar2 = algo[lVar7];
      bVar3 = "DLEQ"[lVar7];
      puVar9 = (uchar *)(ulong)((uint)bVar2 - (uint)bVar3);
      if (bVar2 == bVar3) {
        puVar9 = puVar10;
      }
      iVar8 = (int)puVar9;
      if (bVar2 != bVar3) goto LAB_00117204;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    iVar8 = 0;
LAB_00117204:
    if (iVar8 == 0) {
      local_c8.s[0] = 0x8cc4beac;
      local_c8.s[1] = 0x2e011f3f;
      local_c8.s[2] = 0x355c75fb;
      local_c8.s[3] = 0x3ba6a2c5;
      local_c8.s[4] = 0xe96f3aef;
      local_c8.s[5] = 0x180530fd;
      local_c8.s[6] = 0x94582499;
      local_c8.s[7] = 0x577fd564;
LAB_001172b8:
      local_c8.bytes = 0x40;
      goto LAB_001172c9;
    }
  }
  else if (algolen == 0x10) {
    lVar7 = 0;
    do {
      iVar8 = (uint)algo[lVar7] - (uint)"ECDSAadaptor/non"[lVar7];
      if (algo[lVar7] != "ECDSAadaptor/non"[lVar7]) goto LAB_001171c8;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x10);
    iVar8 = 0;
LAB_001171c8:
    if (iVar8 == 0) {
      local_c8.s[0] = 0x791dae43;
      local_c8.s[1] = 0xe52d3b44;
      local_c8.s[2] = 0x37f9edea;
      local_c8.s[3] = 0x9bfd2ab1;
      local_c8.s[4] = 0xcfb0f44d;
      local_c8.s[5] = 0xccf1d880;
      local_c8.s[6] = 0xd18f2c13;
      local_c8.s[7] = 0xa37b9024;
      goto LAB_001172b8;
    }
  }
  local_c8.s[0] = 0x6a09e667;
  local_c8.s[1] = 0xbb67ae85;
  local_c8.s[2] = 0x3c6ef372;
  local_c8.s[3] = 0xa54ff53a;
  local_c8.s[4] = 0x510e527f;
  local_c8.s[5] = 0x9b05688c;
  local_c8.s[6] = 0x1f83d9ab;
  local_c8.s[7] = 0x5be0cd19;
  local_c8.bytes = 0;
  secp256k1_sha256_write(&local_c8,algo,algolen);
  secp256k1_sha256_finalize(&local_c8,local_58);
  local_c8.s[0] = 0x6a09e667;
  local_c8.s[1] = 0xbb67ae85;
  local_c8.s[2] = 0x3c6ef372;
  local_c8.s[3] = 0xa54ff53a;
  local_c8.s[4] = 0x510e527f;
  local_c8.s[5] = 0x9b05688c;
  local_c8.s[6] = 0x1f83d9ab;
  local_c8.s[7] = 0x5be0cd19;
  local_c8.bytes = 0;
  secp256k1_sha256_write(&local_c8,local_58,0x20);
  secp256k1_sha256_write(&local_c8,local_58,0x20);
LAB_001172c9:
  if (data != (void *)0x0) {
    key32 = (uchar *)local_e8;
  }
  secp256k1_sha256_write(&local_c8,key32,0x20);
  secp256k1_sha256_write(&local_c8,pk33,0x21);
  secp256k1_sha256_write(&local_c8,msg32,0x20);
  secp256k1_sha256_finalize(&local_c8,nonce32);
  return 1;
}

Assistant:

static int nonce_function_ecdsa_adaptor(unsigned char *nonce32, const unsigned char *msg32, const unsigned char *key32, const unsigned char *pk33, const unsigned char *algo, size_t algolen, void *data) {
    secp256k1_sha256 sha;
    unsigned char masked_key[32];
    int i;

    if (algo == NULL) {
        return 0;
    }

    if (data != NULL) {
        secp256k1_nonce_function_ecdsa_adaptor_sha256_tagged_aux(&sha);
        secp256k1_sha256_write(&sha, data, 32);
        secp256k1_sha256_finalize(&sha, masked_key);
        for (i = 0; i < 32; i++) {
            masked_key[i] ^= key32[i];
        }
    }

    /* Tag the hash with algo which is important to avoid nonce reuse across
     * algorithims. An optimized tagging implementation is used if the default
     * tag is provided. */
    if (algolen == sizeof(ecdsa_adaptor_algo)
            && secp256k1_memcmp_var(algo, ecdsa_adaptor_algo, algolen) == 0) {
        secp256k1_nonce_function_ecdsa_adaptor_sha256_tagged(&sha);
    } else if (algolen == sizeof(dleq_algo)
            && secp256k1_memcmp_var(algo, dleq_algo, algolen) == 0) {
        secp256k1_nonce_function_dleq_sha256_tagged(&sha);
    } else {
        secp256k1_sha256_initialize_tagged(&sha, algo, algolen);
    }

    /* Hash (masked-)key||pk||msg using the tagged hash as per BIP-340 */
    if (data != NULL) {
        secp256k1_sha256_write(&sha, masked_key, 32);
    } else {
        secp256k1_sha256_write(&sha, key32, 32);
    }
    secp256k1_sha256_write(&sha, pk33, 33);
    secp256k1_sha256_write(&sha, msg32, 32);
    secp256k1_sha256_finalize(&sha, nonce32);
    return 1;
}